

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizardPrivate::updatePalette(QWizardPrivate *this)

{
  long *plVar1;
  ColorGroup CVar2;
  long in_FS_OFFSET;
  QBrush local_60 [8];
  QColor local_58;
  QColor local_48;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->wizStyle == MacStyle) {
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QApplication::palette((QApplication *)local_38,&this->pageFrame->super_QWidget);
    CVar2 = (ColorGroup)(QPalette *)local_38;
    plVar1 = (long *)QPalette::brush(CVar2,Dark);
    local_48._0_8_ = *(undefined8 *)(*plVar1 + 8);
    local_48._8_8_ = *(undefined8 *)(*plVar1 + 0x10);
    QColor::setAlpha((int)&local_48);
    QBrush::QBrush((QBrush *)&local_58,&local_48,SolidPattern);
    QPalette::setBrush(CVar2,Mid,(QBrush *)&DAT_0000000a);
    QBrush::~QBrush((QBrush *)&local_58);
    plVar1 = (long *)QPalette::brush(CVar2,Dark);
    local_58._0_8_ = *(undefined8 *)(*plVar1 + 8);
    local_58._8_8_ = *(undefined8 *)(*plVar1 + 0x10);
    QColor::setAlpha((int)&local_58);
    QBrush::QBrush(local_60,&local_58,SolidPattern);
    QPalette::setBrush(CVar2,Mid,(QBrush *)0x9);
    QBrush::~QBrush(local_60);
    QWidget::setPalette(&this->pageFrame->super_QWidget,(QPalette *)local_38);
    QPalette::~QPalette((QPalette *)local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::updatePalette() {
    if (wizStyle == QWizard::MacStyle) {
        // This is required to ensure visual semitransparency when
        // switching from ModernStyle to MacStyle.
        // See TAG1 in recreateLayout
        // This additionally ensures that the colors are correct
        // when the theme is changed.

        // we should base the new palette on the default one
        // so theme colors will be correct
        QPalette newPalette = QApplication::palette(pageFrame);

        QColor windowColor = newPalette.brush(QPalette::Window).color();
        windowColor.setAlpha(153);
        newPalette.setBrush(QPalette::Window, windowColor);

        QColor baseColor = newPalette.brush(QPalette::Base).color();
        baseColor.setAlpha(153);
        newPalette.setBrush(QPalette::Base, baseColor);

        pageFrame->setPalette(newPalette);
    }
}